

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall
cmListFileParser::cmListFileParser
          (cmListFileParser *this,cmListFile *lf,cmListFileBacktrace *lfbt,cmMessenger *messenger)

{
  cmListFileLexer *pcVar1;
  cmMessenger *messenger_local;
  cmListFileBacktrace *lfbt_local;
  cmListFile *lf_local;
  cmListFileParser *this_local;
  
  this->ListFile = lf;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,lfbt);
  this->Messenger = messenger;
  this->FileName = (char *)0x0;
  pcVar1 = cmListFileLexer_New();
  this->Lexer = pcVar1;
  std::__cxx11::string::string((string *)&this->FunctionName);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
            (&this->FunctionArguments);
  return;
}

Assistant:

cmListFileParser::cmListFileParser(cmListFile* lf, cmListFileBacktrace lfbt,
                                   cmMessenger* messenger)
  : ListFile(lf)
  , Backtrace(std::move(lfbt))
  , Messenger(messenger)
  , Lexer(cmListFileLexer_New())
{
}